

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_BGIP_Solvers.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  argp_parse(ArgumentHandlers::theArgpStruc,argc,argv,0,0,&args);
  testBGIP_Solvers();
  return 0;
}

Assistant:

int main(int argc, char **argv)
{

    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);
    try
    {
        testBGIP_Solvers();
    }catch(E& e)
    {
        e.Print();
    }
    return(0);
}